

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool ON_GetConicEquationThrough6Points
               (int stride,double *points2d,double *conic,double *max_pivot,double *min_pivot,
               double *zero_pivot)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  bool bVar18;
  undefined4 in_EAX;
  int iVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  double *__s;
  long lVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  double M [5] [5];
  double N [5] [5];
  ON_2dPoint pts [6];
  double dStack_2c0;
  double adStack_2b8 [2];
  double local_2a8;
  undefined1 auStack_2a0 [8];
  double local_298;
  undefined1 local_290 [24];
  double local_278;
  undefined1 auStack_270 [16];
  double local_260;
  double dStack_250;
  double local_248;
  undefined1 local_240 [8];
  double adStack_238 [4];
  undefined1 local_218 [8];
  double adStack_210 [4];
  undefined1 local_1f0 [16];
  double local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double dStack_190;
  undefined1 local_188 [16];
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double local_160 [5];
  undefined8 local_138;
  double local_120;
  undefined8 local_108;
  double local_f8;
  undefined8 local_d8;
  double local_d0;
  double local_a8;
  undefined1 local_98 [80];
  double local_48;
  double dStack_40;
  
  if (conic == (double *)0x0) {
    return false;
  }
  conic[4] = 0.0;
  conic[5] = 0.0;
  conic[2] = 0.0;
  conic[3] = 0.0;
  *conic = 0.0;
  conic[1] = 0.0;
  if (max_pivot != (double *)0x0) {
    *max_pivot = 0.0;
  }
  if (min_pivot != (double *)0x0) {
    *min_pivot = 0.0;
  }
  if (zero_pivot != (double *)0x0) {
    *zero_pivot = 0.0;
  }
  local_98._0_16_ = *(undefined1 (*) [16])points2d;
  uVar31 = local_98._0_4_;
  uVar32 = local_98._4_4_;
  lVar30 = -(ulong)(ABS(local_98._8_8_) < 1.23432101234321e+308);
  auVar2._8_4_ = (int)lVar30;
  auVar2._0_8_ = -(ulong)(ABS(local_98._0_8_) < 1.23432101234321e+308);
  auVar2._12_4_ = (int)((ulong)lVar30 >> 0x20);
  iVar19 = movmskpd(in_EAX,auVar2);
  if (iVar19 == 3) {
    uVar33 = local_98._8_4_;
    uVar35 = local_98._12_4_;
    pauVar20 = (undefined1 (*) [16])(points2d + stride);
    lVar30 = 0x10;
    uVar37 = uVar33;
    uVar39 = uVar35;
    uVar34 = uVar31;
    uVar36 = uVar32;
    do {
      auVar2 = *pauVar20;
      dVar43 = auVar2._0_8_;
      dVar46 = auVar2._8_8_;
      *(undefined1 (*) [16])((long)*(undefined1 (*) [16])local_98 + lVar30) = auVar2;
      auVar48._8_8_ = -(ulong)(ABS(dVar46) < 1.23432101234321e+308);
      auVar48._0_8_ = -(ulong)(ABS(dVar43) < 1.23432101234321e+308);
      uVar26 = movmskpd((int)points2d,auVar48);
      points2d = (double *)(ulong)uVar26;
      if (uVar26 != 3) {
        return false;
      }
      uVar41 = auVar2._0_4_;
      uVar42 = auVar2._4_4_;
      if (((double)CONCAT44(uVar36,uVar34) < dVar43 || (double)CONCAT44(uVar36,uVar34) == dVar43) &&
         (uVar41 = uVar34, uVar42 = uVar36,
         (double)CONCAT44(uVar32,uVar31) <= dVar43 && dVar43 != (double)CONCAT44(uVar32,uVar31))) {
        uVar31 = auVar2._0_4_;
        uVar32 = auVar2._4_4_;
      }
      uVar38 = auVar2._8_4_;
      uVar40 = auVar2._12_4_;
      if (((double)CONCAT44(uVar39,uVar37) < dVar46 || (double)CONCAT44(uVar39,uVar37) == dVar46) &&
         (uVar38 = uVar37, uVar40 = uVar39,
         (double)CONCAT44(uVar35,uVar33) <= dVar46 && dVar46 != (double)CONCAT44(uVar35,uVar33))) {
        uVar33 = auVar2._8_4_;
        uVar35 = auVar2._12_4_;
      }
      lVar30 = lVar30 + 0x10;
      pauVar20 = (undefined1 (*) [16])(*pauVar20 + (long)stride * 8);
      uVar37 = uVar38;
      uVar39 = uVar40;
      uVar34 = uVar41;
      uVar36 = uVar42;
    } while (lVar30 != 0x60);
    dVar43 = (double)CONCAT44(uVar32,uVar31) - (double)CONCAT44(uVar42,uVar41);
    dVar46 = (double)CONCAT44(uVar35,uVar33) - (double)CONCAT44(uVar40,uVar38);
    if (dVar46 <= dVar43) {
      if (dVar43 <= 0.0) {
        return false;
      }
      dVar6 = (dVar46 / dVar43) * (dVar46 / dVar43);
    }
    else {
      dVar6 = (dVar43 / dVar46) * (dVar43 / dVar46);
      dVar43 = dVar46;
    }
    dVar43 = SQRT(dVar6 + 1.0) * dVar43;
    if (0.0 < dVar43) {
      dVar43 = 1.0 / dVar43;
      pauVar20 = (undefined1 (*) [16])local_98;
      local_178 = dVar43;
      uStack_170 = 0;
      lVar30 = 0x18;
      do {
        dVar46 = (*(double *)*pauVar20 - local_48) * dVar43;
        dVar6 = (*(double *)((long)*pauVar20 + 8) - dStack_40) * dVar43;
        auVar7._8_4_ = SUB84(dVar46 * dVar6,0);
        auVar7._0_8_ = dVar46 * dVar46;
        auVar7._12_4_ = (int)((ulong)(dVar46 * dVar6) >> 0x20);
        *(undefined1 (*) [16])((long)&dStack_2c0 + lVar30) = auVar7;
        *(double *)((long)adStack_2b8 + lVar30 + 8) = dVar6 * dVar6;
        auVar3._8_4_ = SUB84(dVar6,0);
        auVar3._0_8_ = dVar46;
        auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
        *(undefined1 (*) [16])(auStack_2a0 + lVar30 + -8) = auVar3;
        lVar30 = lVar30 + 0x28;
        pauVar20 = pauVar20 + 1;
      } while (lVar30 != 0xe0);
      local_198 = local_48;
      dStack_190 = dStack_40;
      local_188._8_4_ = SUB84(dVar43,0);
      local_188._0_8_ = dVar43;
      local_188._12_4_ = (int)((ulong)dVar43 >> 0x20);
      __s = &local_168;
      uVar25 = 0;
      adStack_2b8[1] = 2.84672670676828e-317;
      memset(__s,0,0xc0);
      local_a8 = 1.0;
      local_d8 = 0x3ff0000000000000;
      local_108 = 0x3ff0000000000000;
      local_138 = 0x3ff0000000000000;
      local_168 = 1.0;
      uVar21 = 0;
      dVar43 = ABS(local_2a8);
      do {
        lVar30 = uVar25 * 8;
        uVar25 = uVar25 + 1;
        dVar46 = ABS(*(double *)(auStack_2a0 + lVar30));
        dVar6 = dVar46;
        if (dVar46 <= dVar43) {
          dVar6 = dVar43;
        }
        if (dVar43 < dVar46) {
          uVar21 = uVar25 & 0xffffffff;
        }
        dVar43 = dVar6;
      } while ((int)uVar25 != 0x18);
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        iVar19 = (int)uVar21;
        if (8 < iVar19 + 4U) {
          lVar30 = (long)(iVar19 / 5) * 0x28 + -0x2a8;
          lVar22 = 0;
          do {
            uVar1 = *(undefined8 *)(auStack_2a0 + lVar22 * 8 + -8);
            *(undefined8 *)(auStack_2a0 + lVar22 * 8 + -8) =
                 *(undefined8 *)(auStack_2a0 + lVar22 * 8 + lVar30 + 0x2a0);
            *(undefined8 *)(auStack_2a0 + lVar22 * 8 + lVar30 + 0x2a0) = uVar1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 5);
        }
        if (iVar19 % 5 != 0) {
          lVar22 = (long)(iVar19 % 5);
          lVar30 = lVar22 * 8 + -0x2a8;
          lVar23 = 0;
          do {
            uVar1 = *(undefined8 *)(auStack_2a0 + lVar23 + -8);
            *(undefined8 *)(auStack_2a0 + lVar23 + -8) =
                 *(undefined8 *)(auStack_2a0 + lVar23 + lVar30 + 0x2a0);
            *(undefined8 *)(auStack_2a0 + lVar23 + lVar30 + 0x2a0) = uVar1;
            uVar1 = *(undefined8 *)((long)&local_168 + lVar23);
            *(undefined8 *)((long)&local_168 + lVar23) =
                 *(undefined8 *)((long)&local_168 + lVar23 + lVar22 * 8);
            *(undefined8 *)((long)&local_168 + lVar23 + lVar22 * 8) = uVar1;
            lVar23 = lVar23 + 0x28;
          } while (lVar23 != 200);
        }
        dVar47 = 1.0 / local_2a8;
        local_2a8 = 1.0;
        dVar43 = (double)auStack_2a0 * dVar47;
        dVar46 = local_298 * dVar47;
        unique0x10000402 = SUB84(dVar46,0);
        auStack_2a0 = (undefined1  [8])dVar43;
        unique0x10000406 = (int)((ulong)dVar46 >> 0x20);
        dVar45 = (double)local_290._0_8_ * dVar47;
        dVar47 = (double)local_290._8_8_ * dVar47;
        local_290._8_4_ = SUB84(dVar47,0);
        local_290._0_8_ = dVar45;
        local_290._12_4_ = (int)((ulong)dVar47 >> 0x20);
        lVar30 = 0x40;
        do {
          dVar44 = *(double *)((long)&dStack_2c0 + lVar30);
          if ((dVar44 != 0.0) || (NAN(dVar44))) {
            *(undefined8 *)((long)&dStack_2c0 + lVar30) = 0;
            auVar49._0_8_ = *(double *)((long)adStack_2b8 + lVar30) - dVar44 * dVar43;
            auVar49._8_8_ = *(double *)((long)adStack_2b8 + lVar30 + 8) - dVar44 * dVar46;
            dVar51 = *(double *)(auStack_2a0 + lVar30 + -8);
            *(undefined1 (*) [16])((long)adStack_2b8 + lVar30) = auVar49;
            *(double *)(auStack_2a0 + lVar30 + -8) = dVar51 - dVar44 * dVar45;
            *(double *)(auStack_2a0 + lVar30) = *(double *)(auStack_2a0 + lVar30) - dVar44 * dVar47;
          }
          lVar30 = lVar30 + 0x28;
        } while (lVar30 != 0xe0);
        dVar43 = ABS(local_278);
        uVar21 = 6;
        lVar30 = 0;
        do {
          if (dVar43 < ABS(*(double *)(auStack_270 + lVar30 * 8))) {
            uVar21 = (ulong)((int)lVar30 + 7);
            dVar43 = ABS(*(double *)(auStack_270 + lVar30 * 8));
          }
          lVar30 = lVar30 + 1;
        } while ((int)lVar30 != 0x12);
        dVar46 = dVar43;
        if (dVar43 <= dVar6) {
          dVar46 = dVar6;
        }
        if ((dVar43 != 0.0) || (NAN(dVar43))) {
          uVar26 = (int)uVar21 % 5;
          if (9 < (int)uVar21) {
            lVar30 = 0;
            do {
              uVar1 = *(undefined8 *)(auStack_270 + lVar30 * 8 + -8);
              uVar14 = *(undefined8 *)(auStack_270 + lVar30 * 8);
              uVar15 = *(undefined8 *)((long)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28) + 8);
              *(undefined8 *)(auStack_270 + lVar30 * 8 + -8) =
                   *(undefined8 *)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28);
              *(undefined8 *)(auStack_270 + lVar30 * 8) = uVar15;
              *(undefined8 *)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28) = uVar1;
              *(undefined8 *)((long)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28) + 8) = uVar14;
              lVar30 = lVar30 + 2;
            } while (lVar30 != 4);
          }
          if (1 < (int)uVar26) {
            uVar21 = (ulong)uVar26;
            lVar30 = uVar21 * 8 + -0x2a8;
            lVar22 = 0;
            do {
              uVar1 = *(undefined8 *)(auStack_2a0 + lVar22);
              *(undefined8 *)(auStack_2a0 + lVar22) =
                   *(undefined8 *)(auStack_2a0 + lVar22 + lVar30 + 0x2a0);
              *(undefined8 *)(auStack_2a0 + lVar22 + lVar30 + 0x2a0) = uVar1;
              uVar1 = *(undefined8 *)((long)local_160 + lVar22);
              *(undefined8 *)((long)local_160 + lVar22) =
                   *(undefined8 *)((long)&local_168 + lVar22 + uVar21 * 8);
              *(undefined8 *)((long)&local_168 + lVar22 + uVar21 * 8) = uVar1;
              lVar22 = lVar22 + 0x28;
            } while (lVar22 != 200);
          }
          dVar43 = 1.0 / local_278;
          local_278 = 1.0;
          dVar6 = dVar43 * (double)auStack_270._0_8_;
          auVar10._8_4_ = SUB84(dVar43 * (double)auStack_270._8_8_,0);
          auVar10._0_8_ = dVar6;
          auVar10._12_4_ = (int)((ulong)(dVar43 * (double)auStack_270._8_8_) >> 0x20);
          auStack_270 = auVar10;
          auVar2 = auStack_270;
          local_260 = dVar43 * local_260;
          lVar30 = 0;
          do {
            dVar43 = *(double *)((long)&dStack_250 + lVar30);
            if ((dVar43 != 0.0) || (NAN(dVar43))) {
              *(undefined8 *)((long)&dStack_250 + lVar30) = 0;
              auStack_270._8_8_ = auVar10._8_8_;
              dVar45 = *(double *)(local_240 + lVar30) - dVar43 * (double)auStack_270._8_8_;
              auVar11._8_4_ = SUB84(dVar45,0);
              auVar11._0_8_ = *(double *)(local_240 + lVar30 + -8) - dVar43 * dVar6;
              auVar11._12_4_ = (int)((ulong)dVar45 >> 0x20);
              *(undefined1 (*) [16])(local_240 + lVar30 + -8) = auVar11;
              *(double *)(local_240 + lVar30 + 8) =
                   *(double *)(local_240 + lVar30 + 8) - dVar43 * local_260;
            }
            lVar30 = lVar30 + 0x28;
          } while (lVar30 != 0x78);
          dVar43 = ABS(local_248);
          uVar21 = 0xc;
          lVar30 = 0;
          do {
            if (dVar43 < ABS(*(double *)(local_240 + lVar30 * 8))) {
              uVar21 = (ulong)((int)lVar30 + 0xd);
              dVar43 = ABS(*(double *)(local_240 + lVar30 * 8));
            }
            lVar30 = lVar30 + 1;
          } while ((int)lVar30 != 0xc);
          dVar6 = dVar43;
          if (dVar43 <= dVar46) {
            dVar6 = dVar46;
          }
          if ((dVar43 == 0.0) && (!NAN(dVar43))) {
            if (max_pivot == (double *)0x0) {
              return false;
            }
            *max_pivot = dVar6;
            return false;
          }
          uVar26 = (int)uVar21 % 5;
          auStack_270 = auVar2;
          if (0xe < (int)uVar21) {
            lVar30 = 0;
            do {
              uVar1 = *(undefined8 *)(local_240 + lVar30 * 8 + -8);
              *(undefined8 *)(local_240 + lVar30 * 8 + -8) =
                   *(undefined8 *)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28 + 8);
              *(undefined8 *)(auStack_2a0 + lVar30 * 8 + (uVar21 / 5) * 0x28 + 8) = uVar1;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 3);
          }
          if (2 < (int)uVar26) {
            uVar21 = (ulong)uVar26;
            lVar30 = uVar21 * 8 + -0x2a8;
            lVar22 = 0;
            do {
              uVar1 = *(undefined8 *)(auStack_2a0 + lVar22 + 8);
              *(undefined8 *)(auStack_2a0 + lVar22 + 8) =
                   *(undefined8 *)(auStack_2a0 + lVar22 + lVar30 + 0x2a0);
              *(undefined8 *)(auStack_2a0 + lVar22 + lVar30 + 0x2a0) = uVar1;
              uVar1 = *(undefined8 *)((long)local_160 + lVar22 + 8U);
              *(undefined8 *)((long)local_160 + lVar22 + 8U) =
                   *(undefined8 *)((long)&local_168 + lVar22 + uVar21 * 8);
              *(undefined8 *)((long)&local_168 + lVar22 + uVar21 * 8) = uVar1;
              lVar22 = lVar22 + 0x28;
            } while (lVar22 != 200);
          }
          dVar43 = 1.0 / local_248;
          local_248 = 1.0;
          dVar46 = dVar43 * (double)local_240;
          dVar43 = dVar43 * adStack_238[0];
          unique0x10000426 = SUB84(dVar43,0);
          local_240 = (undefined1  [8])dVar46;
          unique0x1000042a = (int)((ulong)dVar43 >> 0x20);
          auVar2 = _local_240;
          lVar30 = 0;
          do {
            dVar43 = *(double *)((long)adStack_238 + lVar30 + 0x18);
            if ((dVar43 != 0.0) || (NAN(dVar43))) {
              *(undefined8 *)((long)adStack_238 + lVar30 + 0x18) = 0;
              dVar45 = *(double *)(local_218 + lVar30 + 8) - dVar43 * adStack_238[0];
              auVar12._8_4_ = SUB84(dVar45,0);
              auVar12._0_8_ = *(double *)(local_218 + lVar30) - dVar43 * dVar46;
              auVar12._12_4_ = (int)((ulong)dVar45 >> 0x20);
              *(undefined1 (*) [16])(local_218 + lVar30) = auVar12;
            }
            auVar48 = _local_218;
            lVar30 = lVar30 + 0x28;
          } while (lVar30 != 0x50);
          dVar43 = ABS(local_218);
          dVar45 = ABS(local_218._8_8_);
          dVar47 = dVar45;
          if (dVar45 <= dVar43) {
            dVar47 = dVar43;
          }
          uVar31 = local_1f0._0_4_;
          uVar32 = local_1f0._4_4_;
          dVar51 = ABS(local_1f0._0_8_);
          dVar44 = dVar51;
          if (dVar51 <= dVar47) {
            dVar44 = dVar47;
          }
          uVar33 = local_1f0._8_4_;
          uVar35 = local_1f0._12_4_;
          dVar50 = ABS(local_1f0._8_8_);
          dVar17 = dVar50;
          if (dVar50 <= dVar44) {
            dVar17 = dVar44;
          }
          dVar46 = dVar17;
          if (dVar17 <= dVar6) {
            dVar46 = dVar6;
          }
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            uVar37 = local_218._0_4_;
            uVar39 = local_218._4_4_;
            if ((dVar47 < dVar51) || (dVar44 < dVar50)) {
              _local_218 = local_1f0;
              local_1f0 = auVar48;
              uVar34 = uVar37;
              uVar36 = uVar39;
            }
            else {
              uVar33 = local_218._8_4_;
              uVar35 = local_218._12_4_;
              uVar34 = uVar31;
              uVar36 = uVar32;
              uVar31 = uVar37;
              uVar32 = uVar39;
            }
            _local_240 = auVar2;
            if ((dVar43 < dVar45 && dVar51 <= dVar47) || (dVar44 < dVar50)) {
              lVar30 = 0x18;
              do {
                auVar2 = *(undefined1 (*) [16])(auStack_2a0 + lVar30 + -8);
                auVar8._8_4_ = auVar2._0_4_;
                auVar8._0_8_ = auVar2._8_8_;
                auVar8._12_4_ = auVar2._4_4_;
                *(undefined1 (*) [16])(auStack_2a0 + lVar30 + -8) = auVar8;
                auVar2 = *(undefined1 (*) [16])((long)&local_168 + lVar30);
                auVar9._8_4_ = auVar2._0_4_;
                auVar9._0_8_ = auVar2._8_8_;
                auVar9._12_4_ = auVar2._4_4_;
                *(undefined1 (*) [16])((long)&local_168 + lVar30) = auVar9;
                lVar30 = lVar30 + 0x28;
              } while (lVar30 != 0xe0);
              uVar31 = local_218._0_4_;
              uVar32 = local_218._4_4_;
              uVar33 = local_218._8_4_;
              uVar35 = local_218._12_4_;
              uVar34 = local_1f0._0_4_;
              uVar36 = local_1f0._4_4_;
            }
            adStack_210[0] =
                 (1.0 / (double)CONCAT44(uVar32,uVar31)) * (double)CONCAT44(uVar35,uVar33);
            local_218 = (undefined1  [8])0x3ff0000000000000;
            if (((double)CONCAT44(uVar36,uVar34) != 0.0) || (NAN((double)CONCAT44(uVar36,uVar34))))
            {
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   (double)local_1f0._8_8_ - (double)CONCAT44(uVar36,uVar34) * adStack_210[0];
              local_1f0 = auVar16 << 0x40;
            }
            if (max_pivot != (double *)0x0) {
              *max_pivot = dVar46;
            }
            if (min_pivot != (double *)0x0) {
              *min_pivot = dVar46;
            }
            if (zero_pivot != (double *)0x0) {
              *zero_pivot = ABS((double)local_1f0._8_8_);
            }
            lVar23 = 1;
            lVar30 = (long)local_160;
            lVar22 = 0;
            do {
              lVar24 = lVar22 + 1;
              lVar27 = lVar30;
              lVar28 = lVar23;
              do {
                dVar43 = *(double *)(auStack_2a0 + lVar28 * 8 + lVar22 * 0x28 + -8);
                dVar46 = -dVar43;
                if ((dVar43 != dVar46) || (NAN(dVar43) || NAN(dVar46))) {
                  lVar29 = 0;
                  do {
                    *(double *)(lVar27 + lVar29) =
                         *(double *)((long)__s + lVar29) * dVar46 + *(double *)(lVar27 + lVar29);
                    lVar29 = lVar29 + 0x28;
                  } while (lVar29 != 200);
                }
                lVar28 = lVar28 + 1;
                lVar27 = lVar27 + 8;
              } while (lVar28 != 5);
              lVar23 = lVar23 + 1;
              __s = __s + 1;
              lVar30 = lVar30 + 8;
              lVar22 = lVar24;
            } while (lVar24 != 4);
            local_1a8 = local_160[3];
            uStack_1a0 = 0;
            local_1d8 = local_120;
            uStack_1d0 = 0;
            local_1e0 = local_f8;
            local_1b8 = local_d0;
            uStack_1b0 = 0;
            local_1c8 = local_a8;
            uStack_1c0 = 0;
            adStack_2b8[1] = 2.84765604424811e-317;
            bVar18 = ON_IsDegenrateConicHelper(local_160[3],local_120,local_f8,local_d0,local_a8);
            if (bVar18) {
              return false;
            }
            local_178 = local_178 * local_178;
            local_1a8 = local_1a8 * local_178;
            local_1d8 = local_1d8 * local_178;
            local_178 = local_178 * local_1e0;
            dVar46 = -local_198;
            dVar43 = -dStack_190;
            dVar6 = (double)local_188._8_8_ * local_1c8 * dVar43 +
                    dVar46 * (double)local_188._0_8_ * local_1b8 +
                    local_178 * dVar43 * dVar43 +
                    local_1a8 * dVar46 * dVar46 + dVar46 * local_1d8 * dVar43;
            dVar43 = (dVar43 * local_1d8 - (local_1a8 + local_1a8) * local_198) +
                     (double)local_188._0_8_ * local_1b8;
            dVar46 = (dVar46 * local_1d8 - (local_178 + local_178) * dStack_190) +
                     (double)local_188._8_8_ * local_1c8;
            uVar26 = (uint)((ulong)local_1a8 >> 0x20);
            dVar45 = local_1a8;
            if (ABS(local_1a8) < ABS(local_178)) {
              dVar45 = local_178;
            }
            if (dVar45 < 0.0) {
              uVar26 = uVar26 ^ 0x80000000;
              local_1d8 = -local_1d8;
              local_178 = -local_178;
              dVar43 = -dVar43;
              dVar46 = -dVar46;
              dVar6 = -dVar6;
            }
            dVar45 = ABS(local_1a8);
            *(int *)conic = SUB84(local_1a8,0);
            *(uint *)((long)conic + 4) = uVar26;
            conic[1] = local_1d8;
            conic[2] = local_178;
            auVar4._8_4_ = SUB84(dVar46,0);
            auVar4._0_8_ = dVar43;
            auVar4._12_4_ = (int)((ulong)dVar46 >> 0x20);
            *(undefined1 (*) [16])(conic + 3) = auVar4;
            conic[5] = dVar6;
            uVar25 = 0;
            uVar21 = 0;
            do {
              if (dVar45 < ABS(conic[uVar25])) {
                uVar21 = uVar25 & 0xffffffff;
                dVar45 = ABS(conic[uVar25]);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != 6);
            dVar45 = conic[(int)uVar21];
            if ((dVar45 == 0.0) && (!NAN(dVar45))) {
              return false;
            }
            dVar45 = 1.0 / dVar45;
            auVar13._8_4_ = SUB84(local_1d8 * dVar45,0);
            auVar13._0_8_ = (double)CONCAT44(uVar26,SUB84(local_1a8,0)) * dVar45;
            auVar13._12_4_ = (int)((ulong)(local_1d8 * dVar45) >> 0x20);
            *(undefined1 (*) [16])conic = auVar13;
            conic[2] = local_178 * dVar45;
            auVar5._8_4_ = SUB84(dVar46 * dVar45,0);
            auVar5._0_8_ = dVar43 * dVar45;
            auVar5._12_4_ = (int)((ulong)(dVar46 * dVar45) >> 0x20);
            *(undefined1 (*) [16])(conic + 3) = auVar5;
            conic[5] = dVar6 * dVar45;
            conic[(int)uVar21] = 1.0;
            return true;
          }
        }
        if (max_pivot != (double *)0x0) {
          *max_pivot = dVar46;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_GetConicEquationThrough6Points( 
        int stride, 
        const double* points2d, 
        double conic[6],
        double* max_pivot,
        double* min_pivot,
        double* zero_pivot
        )
{
  // Sets conic[] to the coefficients = (A,B,C,D,E,F),
  // such that A*x*x + B*x*y + C*y*y + D*x + E*y + F = 0
  // for each of the 6 input points.

  // This code is long and ugly.  The reason for unrolling the 
  // obvious loops is to make it as efficient as possible.  
  // Rhino calls this function in time critical situations.
  //

  ON_2dPoint pts[6], bboxmin, bboxmax;
  double scale, x, y, M[5][5], N[5][5], max_piv, min_piv;
  const double* p;
  int i, j, k;

  if ( 0 == conic )
    return false;
  memset(conic,0,6*sizeof(conic[0]));
  if ( max_pivot )
    *max_pivot = 0.0;
  if ( min_pivot )
    *min_pivot = 0.0;
  if ( zero_pivot )
    *zero_pivot = 0.0;

  // copy input points into pts[6] and calculate bounding box
  bboxmin.x = bboxmax.x = pts[0].x = points2d[0];
  bboxmin.y = bboxmax.y = pts[0].y = points2d[1];
  if ( !pts[0].IsValid() )
    return false;
  for ( i = 1; i < 6; i++ )
  {
    points2d += stride;
    pts[i].x = points2d[0];
    pts[i].y = points2d[1];
    if ( !pts[i].IsValid() )
      return false;
    if ( pts[i].x < bboxmin.x ) bboxmin.x = pts[i].x; 
    else if ( pts[i].x > bboxmax.x ) bboxmax.x = pts[i].x;
    if ( pts[i].y < bboxmin.y ) bboxmin.y = pts[i].y; 
    else if ( pts[i].y > bboxmax.y ) bboxmax.y = pts[i].y;
  }

  // translate and scale pts[] so pts[5] is at the origin and
  // (pts[0],...pts[4]) have and have a "diameter" near 1.
  // This keeps the starting coefficients in M[][] less than 5
  // with the largest generally near one.
  x = bboxmax.x-bboxmin.x;
  y = bboxmax.y-bboxmin.y;
  if ( x >= y )
  {
    if ( x > 0.0 )
    {
      y /= x;
      scale = x*sqrt(1.0 + y*y);
    }
    else
      return false;
  }
  else 
  {
    x /= y;
    scale = y*sqrt(1.0 + x*x);
  }
  if ( scale > 0.0 )
    scale = 1.0/scale;
  else
    return false;

  for ( i = 0; i < 5; i++ )
  {
    x = scale*(pts[i].x - pts[5].x);
    y = scale*(pts[i].y - pts[5].y);
    M[i][0] = x*x;
    M[i][1] = x*y;
    M[i][2] = y*y;
    M[i][3] = x;
    M[i][4] = y;
  }

  memset( N,0,sizeof(N) );
  N[0][0] = N[1][1] = N[2][2] = N[3][3] = N[4][4] = 1.0;

  // The conic (A,B,C,D,E) is the kernel of M.

  //////////////////////////////////////////////////////////
  //
  // find first pivot
  //
  j = 0;
  p = &M[0][0];
  x = fabs(*p);
  for ( i = 1; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  max_piv = min_piv = x;
  if ( 0.0 == x )
    return false; // all input points are equal
  i = j/5;
  j %= 5;

  if ( 0 != i )
  {
    // swap rows M[0][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[0][k]; M[0][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( 0 != j )
  {
    // Swap columns M[][0] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][0]; M[k][0] = M[k][j]; M[k][j] = y;
      y = N[k][0]; N[k][0] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[0][] so that M[0][0] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[0][0];
  M[0][0] = 1.0; 
  M[0][1] *= x; M[0][2] *= x; M[0][3] *= x; M[0][4] *= x;

  // kill column M[1,2,3,4][0]
  for ( i = 1; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][0]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][0] = 0.0; // set to zero so search for pivot is faster
      M[i][1] += y*M[0][1]; M[i][2] += y*M[0][2]; M[i][3] += y*M[0][3]; M[i][4] += y*M[0][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find second pivot
  //
  j = 6;
  p = &M[1][1];
  x = fabs(*p);
  for ( i = 7; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // two distinct points in input point list.
  }
  i = j/5;  // should always be >= 1
  j %= 5;   // should always be >= 1

  if ( i > 1 )
  {
    // swap rows M[1][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 1; k < 5; k++ )
    {
      y = M[1][k]; M[1][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 1 )
  {
    // Swap columns M[][1] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][1]; M[k][1] = M[k][j]; M[k][j] = y;
      y = N[k][1]; N[k][1] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[1][] so that M[1][1] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[1][1];
  M[1][1] = 1.0; 
  M[1][2] *= x; M[1][3] *= x; M[1][4] *= x;

  // kill column M[2,3,4][1]
  for ( i = 2; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][1]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][1] = 0.0; // set to zero so search for pivot is faster
      M[i][2] += y*M[1][2]; M[i][3] += y*M[1][3]; M[i][4] += y*M[1][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find third pivot
  //
  j = 12;
  p = &M[2][2];
  x = fabs(*p);
  for ( i = 13; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // three distinct points in input point list.
  }
  i = j/5;  // should always be >= 2
  j %= 5;   // should always be >= 2

  if ( i > 2 )
  {
    // swap rows M[2][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 2; k < 5; k++ )
    {
      y = M[2][k]; M[2][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 2 )
  {
    // Swap columns M[][2] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][2]; M[k][2] = M[k][j]; M[k][j] = y;
      y = N[k][2]; N[k][2] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[2][] so that M[2][2] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[2][2];
  M[2][2] = 1.0; M[2][3] *= x; M[2][4] *= x;

  // kill column M[3,4][2]
  for ( i = 3; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][2]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][2] = 0.0; // set to zero so search for pivot is faster
      M[i][3] += y*M[2][3]; M[i][4] += y*M[2][4];
    }
  }

  //////////////////////////////////////////////////////////
  //
  // find fourth pivot
  //
  i = j = 3;
  x = fabs(M[3][3]);
  if ( x < (y = fabs(M[3][4])) )
  {
    x = y; j = 4;
  }
  if ( x < (y = fabs(M[4][3])) )
  {
    x = y; i = 4; j = 3;
  }
  if ( x < (y = fabs(M[4][4])) )
  {
    x = y; i = j = 4;
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // four distinct points in the input point list.
  }

  if ( i > 3 )
  {
    // swap rows M[3][] and M[i][]
    // Do not modify N[][] because row ops act on the left of M.
    y = M[3][3]; M[3][3] = M[4][3]; M[4][3] = y;
    y = M[3][4]; M[3][4] = M[i][4]; M[4][4] = y;
  }
  if ( j > 3 )
  {
    // Swap columns M[][3] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][3]; M[k][3] = M[k][4]; M[k][4] = y;
      y = N[k][3]; N[k][3] = N[k][4]; N[k][4] = y;
    }
  }

  // scale row M[3][] so that M[3][3] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[3][3];
  M[3][3] = 1.0; 
  M[3][4] *= x;

  // kill column M[4][3]
  if ( 0.0 != M[4][3] )
  {
    // use row op M[i][] += y*M[3][]
    // Do not modify N because row ops act on the left of M.
    M[4][4] -= M[4][3]*M[3][4];
    M[4][3] = 0.0; // set to zero so search for pivot is faster
  }

  // By construction, M[][] is singular and M[4][4] should be nearly zero.
  // It should be upper triangular with diagonal 1,1,1,1,0-ish
  if ( max_pivot )
    *max_pivot = max_piv;
  if ( min_pivot )
    *min_pivot = max_piv;
  if ( zero_pivot )
    *zero_pivot = fabs(M[4][4]);

  // Use column operations to make M[][] the identity.
  // The operations must also be applied to N[][] in order to
  // calculate the kernel of the original M[][].
  for ( i = 0; i < 4; i++ )
  {
    for (j = i+1; j < 5; j++ )
    {
      if ( 0.0 != (y = -M[i][j]) )
      {
        // waste of time // M[i][j] = 0.0;
        for ( k = 0; k < 5; k++ )
        {
          //M[k][j] += y*M[k][i];
          N[k][j] += y*N[k][i];
        }
      }
    }
  }

  // At this point, M[][] should be reduced to a diagonal matrix with 
  // 1,1,1,1,0 on the diagonal. The vector (A,B,C,D,E) = N*Transpose(0,0,0,0,1)
  // will be in the kernel of the original M[][]. The conic through the 
  // six points( scale*(pts[0]-pts[5]),...,scale*(pts[4]-pts[5]),(0,0) ) 
  // is Ax^2 + Bxy + Cy^2 + Dx + Ey = 0.
  // We need to apply the inverse of the scale and then translate by 
  // (pts[5].x,pts[5].y) to get the equation of the conic through the 
  // input point list.

  double A = N[0][4];
  double B = N[1][4];
  double C = N[2][4];
  double D = N[3][4];
  double E = N[4][4];
  // F = 0

  // check for collinear point set
  if ( ON_IsDegenrateConicHelper(A,B,C,D,E) )
  {
    // points lie on one or two lines
    return false;
  }

  // points are not collinear

  // undo the scale we applied when we calculated M[][]
  x = scale*scale;
  A *= x;
  B *= x;
  C *= x;
  D *= scale;
  E *= scale;

  // undo the translation of pts[5] to (0,0) we applied when we calculated M[][]
  x = -pts[5].x;
  y = -pts[5].y;
  double F = A*x*x + B*x*y + C*y*y + D*x + E*y;
  D += 2.0*A*x + B*y;
  E += 2.0*C*y + B*x;

  if ( (fabs(A) >= fabs(C)) ? (A<0.0):(C<0.0) )
  {
    // Make the largest A/C coefficient positive.
    A = -A; B = -B; C = -C; D = -D; E = -E; F = -F;
  }

  conic[0] = A; conic[1] = B; conic[2] = C;
  conic[3] = D; conic[4] = E; conic[5] = F;

  //
  j = 0;
  x = fabs(conic[0]);
  for ( i = 0; i < 6; i++ )
  {
    if ( x < (y = fabs(conic[i])) )
    {
      x = y;
      j = i;
    }
  }
  if ( !(conic[j] != 0.0) )
    return false;
  y = 1.0/conic[j];
  conic[0] *= y; conic[1] *= y; conic[2] *= y; 
  conic[3] *= y; conic[4] *= y; conic[5] *= y; 
  conic[j] = 1.0;

  return true;
}